

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

TRef crec_ct_tv(jit_State *J,CType *d,TRef dp,TRef sp,cTValue *sval)

{
  ushort uVar1;
  TRef TVar2;
  TRef TVar3;
  jit_State *cts_00;
  CType *pCVar4;
  GCcdata *pGVar5;
  uint in_ECX;
  uint *in_RSI;
  jit_State *in_RDI;
  uint *in_R8;
  IRType t;
  CType *cct;
  CTSize ofs;
  GCstr *str;
  TRef tr;
  GCudata *ud;
  CType *s;
  void *svisnz;
  CTypeID sid;
  CTState *cts;
  CType *ct;
  undefined4 in_stack_fffffffffffffd38;
  TraceError in_stack_fffffffffffffd3c;
  jit_State *in_stack_fffffffffffffd40;
  jit_State *pjVar6;
  undefined4 in_stack_fffffffffffffd48;
  undefined2 in_stack_fffffffffffffd4c;
  IRRef1 in_stack_fffffffffffffd4e;
  IRRef1 IVar7;
  cTValue *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined2 in_stack_fffffffffffffd5c;
  undefined2 in_stack_fffffffffffffd5e;
  jit_State *in_stack_fffffffffffffd60;
  undefined6 in_stack_fffffffffffffd68;
  undefined2 in_stack_fffffffffffffd6e;
  IRType local_274;
  CType *local_248;
  IRRef1 local_220;
  CType *local_208;
  jit_State *in_stack_fffffffffffffe28;
  CType *in_stack_fffffffffffffe30;
  jit_State *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  jit_State *in_stack_fffffffffffffe48;
  CType *local_f0;
  
  cts_00 = (jit_State *)(ulong)in_RDI[-1].bpropcache[9].mode;
  pjVar6 = cts_00;
  if ((4 < (in_ECX >> 0x18 & 0x1f) - 0xf) && ((in_ECX & 0x1f000000) != 0xe000000)) {
    if ((in_ECX >> 0x18 & 0x1f) - 1 < 2) {
      lj_ir_kint((jit_State *)&in_stack_fffffffffffffd50->field_2,
                 CONCAT22(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd4c));
    }
    else if ((in_ECX & 0x1f000000) == 0) {
      lj_ir_kptr_(in_stack_fffffffffffffd60,
                  CONCAT22(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd5c),
                  in_stack_fffffffffffffd50);
    }
    else {
      IVar7 = (IRRef1)in_ECX;
      if ((in_ECX & 0x1f000000) == 0xc000000) {
        if (*(char *)((ulong)*in_R8 + 6) == '\x01') {
          (in_RDI->fold).ins.field_0.ot = 0x4310;
          (in_RDI->fold).ins.field_0.op1 = IVar7;
          (in_RDI->fold).ins.field_0.op2 = 10;
          TVar3 = lj_opt_fold((jit_State *)
                              CONCAT26(in_stack_fffffffffffffd4e,
                                       CONCAT24(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
                                      ));
          TVar2 = lj_ir_kint((jit_State *)&in_stack_fffffffffffffd50->field_2,
                             CONCAT22(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd4c));
          (in_RDI->fold).ins.field_0.ot = 0x893;
          (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar3;
          (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar2;
          lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_fffffffffffffd4e,
                               CONCAT24(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)));
          (in_RDI->fold).ins.field_0.ot = 0x4309;
          (in_RDI->fold).ins.field_0.op1 = IVar7;
          (in_RDI->fold).ins.field_0.op2 = 0xb;
          lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_fffffffffffffd4e,
                               CONCAT24(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)));
        }
        else {
          TVar3 = lj_ir_kint64(in_stack_fffffffffffffd40,
                               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
          (in_RDI->fold).ins.field_0.ot = 0x2809;
          (in_RDI->fold).ins.field_0.op1 = IVar7;
          (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar3;
          lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_fffffffffffffd4e,
                               CONCAT24(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)));
        }
      }
      else if ((in_ECX & 0x1f000000) == 0x4000000) {
        if (*in_RSI >> 0x1c == 5) {
          pCVar4 = lj_ctype_getfieldq((CTState *)
                                      CONCAT26(in_stack_fffffffffffffd6e,in_stack_fffffffffffffd68),
                                      (CType *)in_stack_fffffffffffffd60,
                                      (GCstr *)CONCAT26(in_stack_fffffffffffffd5e,
                                                        CONCAT24(in_stack_fffffffffffffd5c,
                                                                 in_stack_fffffffffffffd58)),
                                      (CTSize *)&in_stack_fffffffffffffd50->u64,
                                      (CTInfo *)
                                      CONCAT26(in_stack_fffffffffffffd4e,
                                               CONCAT24(in_stack_fffffffffffffd4c,
                                                        in_stack_fffffffffffffd48)));
          TVar3 = lj_ir_kgc(in_RDI,(GCobj *)CONCAT26(in_stack_fffffffffffffd5e,
                                                     CONCAT24(in_stack_fffffffffffffd5c,
                                                              in_stack_fffffffffffffd58)),
                            (IRType)((ulong)in_stack_fffffffffffffd50 >> 0x20));
          (in_RDI->fold).ins.field_0.ot = 0x884;
          (in_RDI->fold).ins.field_0.op1 = IVar7;
          (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar3;
          lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_fffffffffffffd4e,
                               CONCAT24(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)));
          if ((pCVar4 != (CType *)0x0) && (pCVar4->info >> 0x1c == 0xb)) {
            lj_ir_kint((jit_State *)&in_stack_fffffffffffffd50->field_2,
                       CONCAT22(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd4c));
          }
        }
        else {
          if ((*in_RSI & 0xfc000000) == 0x30000000) {
            lj_trace_err(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
          }
          TVar3 = lj_ir_kint64(in_stack_fffffffffffffd40,
                               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
          (in_RDI->fold).ins.field_0.ot = 0x2809;
          (in_RDI->fold).ins.field_0.op1 = IVar7;
          (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar3;
          lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_fffffffffffffd4e,
                               CONCAT24(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)));
        }
      }
      else {
        pGVar5 = argv2cdata(in_stack_fffffffffffffd60,
                            CONCAT22(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd5c),
                            in_stack_fffffffffffffd50);
        pCVar4 = *(CType **)&cts_00->cur + pGVar5->ctypeid;
        while (local_208 = pCVar4, local_208->info >> 0x1c == 8) {
          in_stack_fffffffffffffe44 = local_208->info & 0xffff;
          in_stack_fffffffffffffe30 = local_208;
          in_stack_fffffffffffffe38 = cts_00;
          in_stack_fffffffffffffe48 = cts_00;
          pCVar4 = *(CType **)&cts_00->cur + in_stack_fffffffffffffe44;
        }
        local_248 = local_208;
        local_274 = crec_ct2irt((CTState *)cts_00,local_208);
        uVar1 = (ushort)local_274;
        if (local_208->info >> 0x1c == 2) {
          (in_RDI->fold).ins.field_0.ot = uVar1 | 0x4300;
          (in_RDI->fold).ins.field_0.op1 = IVar7;
          (in_RDI->fold).ins.field_0.op2 = 0xd;
          TVar3 = lj_opt_fold((jit_State *)
                              CONCAT26(in_stack_fffffffffffffd4e,
                                       CONCAT24(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
                                      ));
          local_220 = (IRRef1)TVar3;
          pjVar6 = in_stack_fffffffffffffe28;
          if ((local_208->info & 0xf0800000) != 0x20800000) goto LAB_0015af0f;
          local_f0 = local_208;
          do {
            local_248 = *(CType **)&cts_00->cur + (local_f0->info & 0xffff);
            local_f0 = local_248;
          } while (local_248->info >> 0x1c == 8);
          if (local_248->info >> 0x1c == 5) {
            local_248 = *(CType **)&cts_00->cur + (local_248->info & 0xffff);
          }
          local_274 = crec_ct2irt((CTState *)cts_00,local_248);
          IVar7 = in_stack_fffffffffffffd4e;
        }
        else {
          if ((local_274 == IRT_I64) || (local_274 == IRT_U64)) {
            (in_RDI->fold).ins.field_0.ot = uVar1 | 0x4300;
            (in_RDI->fold).ins.field_0.op1 = IVar7;
            (in_RDI->fold).ins.field_0.op2 = 0xf;
            lj_opt_fold((jit_State *)
                        CONCAT26(in_stack_fffffffffffffd4e,
                                 CONCAT24(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)));
            pjVar6 = in_stack_fffffffffffffe28;
            goto LAB_0015af0f;
          }
          if ((local_274 == IRT_INT) || (local_274 == IRT_U32)) {
            (in_RDI->fold).ins.field_0.ot = uVar1 | 0x4300;
            (in_RDI->fold).ins.field_0.op1 = IVar7;
            (in_RDI->fold).ins.field_0.op2 = 0xe;
            lj_opt_fold((jit_State *)
                        CONCAT26(in_stack_fffffffffffffd4e,
                                 CONCAT24(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)));
            pjVar6 = in_stack_fffffffffffffe28;
            goto LAB_0015af0f;
          }
          pjVar6 = in_RDI;
          TVar3 = lj_ir_kint64(in_RDI,CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))
          ;
          (pjVar6->fold).ins.field_0.ot = 0x2809;
          (pjVar6->fold).ins.field_0.op1 = IVar7;
          (pjVar6->fold).ins.field_0.op2 = (IRRef1)TVar3;
          TVar3 = lj_opt_fold((jit_State *)
                              CONCAT26(IVar7,CONCAT24(in_stack_fffffffffffffd4c,
                                                      in_stack_fffffffffffffd48)));
          local_220 = (IRRef1)TVar3;
        }
        pjVar6 = in_stack_fffffffffffffe28;
        if ((local_248->info >> 0x1c == 0) && (local_274 != IRT_CDATA)) {
          (in_RDI->fold).ins.field_0.ot = (ushort)local_274 | 0x4400;
          (in_RDI->fold).ins.field_0.op1 = local_220;
          (in_RDI->fold).ins.field_0.op2 = 0;
          lj_opt_fold((jit_State *)
                      CONCAT26(IVar7,CONCAT24(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)))
          ;
          pjVar6 = in_stack_fffffffffffffe28;
        }
      }
    }
  }
LAB_0015af0f:
  TVar3 = crec_ct_ct(in_stack_fffffffffffffe48,
                     (CType *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (CType *)in_stack_fffffffffffffe38,
                     (TRef)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                     (TRef)in_stack_fffffffffffffe30,pjVar6);
  return TVar3;
}

Assistant:

static TRef crec_ct_tv(jit_State *J, CType *d, TRef dp, TRef sp, cTValue *sval)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID sid = CTID_P_VOID;
  void *svisnz = 0;
  CType *s;
  if (LJ_LIKELY(tref_isinteger(sp))) {
    sid = CTID_INT32;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isnum(sp)) {
    sid = CTID_DOUBLE;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isbool(sp)) {
    sp = lj_ir_kint(J, tref_istrue(sp) ? 1 : 0);
    sid = CTID_BOOL;
  } else if (tref_isnil(sp)) {
    sp = lj_ir_kptr(J, NULL);
  } else if (tref_isudata(sp)) {
    GCudata *ud = udataV(sval);
    if (ud->udtype == UDTYPE_IO_FILE) {
      TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), sp, IRFL_UDATA_UDTYPE);
      emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, UDTYPE_IO_FILE));
      sp = emitir(IRT(IR_FLOAD, IRT_PTR), sp, IRFL_UDATA_FILE);
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCudata)));
    }
  } else if (tref_isstr(sp)) {
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      GCstr *str = strV(sval);
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      /* Specialize to the name of the enum constant. */
      emitir(IRTG(IR_EQ, IRT_STR), sp, lj_ir_kstr(J, str));
      if (cct && ctype_isconstval(cct->info)) {
	lua_assert(ctype_child(cts, cct)->size == 4);
	svisnz = (void *)(intptr_t)(ofs != 0);
	sp = lj_ir_kint(J, (int32_t)ofs);
	sid = ctype_cid(cct->info);
      }  /* else: interpreter will throw. */
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);  /* NYI */
    } else {  /* Otherwise pass the string data as a const char[]. */
      /* Don't use STRREF. It folds with SNEW, which loses the trailing NUL. */
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCstr)));
      sid = CTID_A_CCHAR;
    }
  } else {  /* NYI: tref_istab(sp), tref_islightud(sp). */
    IRType t;
    sid = argv2cdata(J, sp, sval)->ctypeid;
    s = ctype_raw(cts, sid);
    svisnz = cdataptr(cdataV(sval));
    t = crec_ct2irt(cts, s);
    if (ctype_isptr(s->info)) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_PTR);
      if (ctype_isref(s->info)) {
	svisnz = *(void **)svisnz;
	s = ctype_rawchild(cts, s);
	if (ctype_isenum(s->info)) s = ctype_child(cts, s);
	t = crec_ct2irt(cts, s);
      } else {
	goto doconv;
      }
    } else if (t == IRT_I64 || t == IRT_U64) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT64);
      lj_needsplit(J);
      goto doconv;
    } else if (t == IRT_INT || t == IRT_U32) {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT);
      goto doconv;
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCcdata)));
    }
    if (ctype_isnum(s->info) && t != IRT_CDATA)
      sp = emitir(IRT(IR_XLOAD, t), sp, 0);  /* Load number value. */
    goto doconv;
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  return crec_ct_ct(J, d, s, dp, sp, svisnz);
}